

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmMul(word *c,word *a,word *b,qr_o *r,void *stack)

{
  size_t n;
  void *stack_00;
  
  n = r->n;
  stack_00 = (void *)(n * 0x10 + (long)stack);
  zzMul((word *)stack,a,n,b,n,stack_00);
  zzRed((word *)stack,r->mod,r->n,stack_00);
  wwCopy(c,(word *)stack,r->n);
  return;
}

Assistant:

static void zmMul(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	stack = prod + 2 * r->n;
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRed(prod, r->mod, r->n, stack);
	wwCopy(c, prod, r->n);
}